

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_image_extract_palette_to_buffer(rf_image image,rf_color *palette_dst,rf_int palette_size)

{
  rf_source_location source_location;
  int iVar1;
  rf_color rVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  
  uVar6 = image.format - RF_UNCOMPRESSED_GRAYSCALE;
  if (uVar6 < 10) {
    if (palette_size < 1) {
      rf_log_impl(4,0x17ca6e);
    }
    else {
      iVar1 = rf_bits_per_pixel(image.format);
      iVar1 = iVar1 * image.height * image.width;
      iVar3 = iVar1 + 7;
      if (-1 < iVar1) {
        iVar3 = iVar1;
      }
      if (uVar6 < 10) {
        lVar7 = *(long *)(&DAT_0017bf58 + (ulong)uVar6 * 8);
      }
      else {
        lVar7 = 0;
      }
      if (7 < iVar1) {
        lVar8 = 0;
        lVar5 = 0;
        do {
          rVar2 = rf_format_one_pixel_to_rgba32(image.data,image.format);
          if (0 < lVar5) {
            lVar4 = 0;
            do {
              if (palette_dst[lVar4] == rVar2) goto LAB_00127a29;
              lVar4 = lVar4 + 1;
            } while (lVar5 != lVar4);
          }
          palette_dst[lVar5] = rVar2;
          lVar5 = lVar5 + 1;
LAB_00127a29:
          lVar8 = lVar8 + lVar7;
        } while ((lVar8 < iVar3 >> 3) && (lVar5 < palette_size));
      }
    }
  }
  else {
    source_location.proc_name._0_4_ = 0x17ca4b;
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.proc_name._4_4_ = 0;
    source_location.line_in_file = 0x3bff;
    rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                "Function only works for uncompressed formats but was called with format %d.",1,
                (ulong)image.format,in_R8,in_R9);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_image_extract_palette_to_buffer";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3bff;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
  }
  return;
}

Assistant:

RF_API void rf_image_extract_palette_to_buffer(rf_image image, rf_color* palette_dst, rf_int palette_size)
{
    if (rf_is_uncompressed_format(image.format))
    {
        if (palette_size > 0)
        {
            int img_size = rf_image_size(image);
            int img_bpp  = rf_bytes_per_pixel(image.format);
            const unsigned char* img_data = (unsigned char*) image.data;

            for (rf_int img_iter = 0, palette_iter = 0; img_iter < img_size && palette_iter < palette_size; img_iter += img_bpp)
            {
                rf_color color = rf_format_one_pixel_to_rgba32(img_data, image.format);

                bool color_found = false;

                for (rf_int i = 0; i < palette_iter; i++)
                {
                    if (rf_color_match(palette_dst[i], color))
                    {
                        color_found = true;
                        break;
                    }
                }

                if (!color_found)
                {
                    palette_dst[palette_iter] = color;
                    palette_iter++;
                }
            }
        }
        else RF_LOG(RF_LOG_TYPE_WARNING, "Palette size was 0.");
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Function only works for uncompressed formats but was called with format %d.", image.format);
}